

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Implicit_manifold_intersection_oracle.h
# Opt level: O2

VectorXd __thiscall
Gudhi::coxeter_triangulation::
Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
::
compute_boundary_lambda<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
          (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
           *this,Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *simplex,
          Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          *triangulation)

{
  double *pdVar1;
  Scalar SVar2;
  pointer piVar3;
  bool bVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Vertex_handle *in_RCX;
  Index extraout_RDX;
  size_t i_1;
  long col;
  ulong uVar7;
  ulong row;
  size_t i;
  double *pdVar8;
  VectorXd VVar9;
  VectorXd bv_coords;
  VectorXd z;
  _Vector_base<int,_std::allocator<int>_> local_178;
  bool local_160;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_158;
  MatrixXd matrix;
  void *local_138 [2];
  VectorXd v_coords;
  vector<int,_std::allocator<int>_> v;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0;
  undefined1 local_d0 [160];
  
  piVar3 = (simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar1 = (double *)((long)piVar3 + 2);
  local_d0._8_8_ = local_d0._0_8_;
  local_d0._0_8_ = pdVar1;
  z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&matrix,(unsigned_long *)local_d0,(unsigned_long *)&z);
  for (pdVar8 = (double *)0x0; pdVar1 != pdVar8; pdVar8 = (double *)((long)pdVar8 + 1)) {
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&matrix,0,
                        (Index)pdVar8);
    *pSVar5 = 1.0;
  }
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::vertex_range((Vertex_range *)local_d0,
                 (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)triangulation);
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::Vertex_iterator((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)&z,(Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           *)local_d0);
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::Vertex_iterator(&__end0,(Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             *)(local_d0 + 0x30));
  uVar7 = (long)piVar3 + 1;
  local_158 = simplex + 1;
  col = 0;
  while ((local_160 != true || ((__end0.is_end_ & 1U) == 0))) {
    std::vector<int,_std::allocator<int>_>::vector
              (&v,(vector<int,_std::allocator<int>_> *)&local_178);
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::cartesian_coordinates
              ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)&bv_coords,in_RCX,1.0);
    Function_Sm_in_Rd::operator()((Function_Sm_in_Rd *)&v_coords,(VectorXd *)simplex);
    free(bv_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    for (row = 1; row < uVar7; row = row + 1) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&v_coords,
                          row - 1);
      SVar2 = *pSVar6;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&matrix,
                          row,col);
      *pSVar5 = SVar2;
    }
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::cartesian_coordinates
              ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)local_138,in_RCX,1.0);
    Function_Sm_in_Rd::operator()((Function_Sm_in_Rd *)&bv_coords,(VectorXd *)local_158);
    free(local_138[0]);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&bv_coords,0);
    SVar2 = *pSVar6;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&matrix,
                        uVar7,col);
    *pSVar5 = SVar2;
    col = col + 1;
    free(bv_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(v_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&v.super__Vector_base<int,_std::allocator<int>_>);
    Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::increment((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)&z);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&__end0.value_.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_178);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base
            ((iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
              *)local_d0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>(&z,(unsigned_long *)local_d0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&z,0);
  *pSVar6 = 1.0;
  for (pdVar8 = (double *)0x1; pdVar8 < pdVar1; pdVar8 = (double *)((long)pdVar8 + 1)) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&z,
                        (Index)pdVar8);
    *pSVar6 = 0.0;
  }
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d0,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&matrix);
  __end0._0_16_ =
       Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
       solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                 ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                  local_d0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
             (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&__end0);
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
            ((ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d0);
  local_d0._0_16_ =
       (undefined1  [16])
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&matrix,
                  (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  __end0.o_it_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3d719799812dea11;
  bVar4 = Eigen::internal::
          isApprox_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_false>
          ::run(&z,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)local_d0,(RealScalar *)&__end0);
  if (!bVar4) {
    for (uVar7 = 0; uVar7 < *(ulong *)(this + 8); uVar7 = uVar7 + 1) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,uVar7);
      *pSVar6 = NAN;
    }
  }
  free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd compute_boundary_lambda(const Simplex_handle& simplex, const Triangulation& triangulation) const {
    std::size_t cod_d = this->cod_d();
    Eigen::MatrixXd matrix(cod_d + 2, cod_d + 2);
    for (std::size_t i = 0; i < cod_d + 2; ++i) matrix(0, i) = 1;
    std::size_t j = 0;
    for (auto v : simplex.vertex_range()) {
      Eigen::VectorXd v_coords = fun_(triangulation.cartesian_coordinates(v));
      for (std::size_t i = 1; i < cod_d + 1; ++i) matrix(i, j) = v_coords(i - 1);
      Eigen::VectorXd bv_coords = domain_fun_(triangulation.cartesian_coordinates(v));
      matrix(cod_d + 1, j) = bv_coords(0);
      j++;
    }
    Eigen::VectorXd z(cod_d + 2);
    z(0) = 1;
    for (std::size_t i = 1; i < cod_d + 2; ++i) z(i) = 0;
    Eigen::VectorXd lambda = matrix.colPivHouseholderQr().solve(z);
    if (!z.isApprox(matrix*lambda)) {
      // NaN non valid results
      for (std::size_t i = 0; i < (std::size_t)lambda.size(); ++i) lambda(i) =
        std::numeric_limits<double>::quiet_NaN();
    }
    return lambda;
  }